

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O0

bool __thiscall
Matrix::AddColumn(Matrix *this,int first_column,int second_column,Fraction coefficient)

{
  bool bVar1;
  reference pvVar2;
  reference pvVar3;
  Fraction local_48;
  Fraction local_40;
  int local_38;
  byte local_31;
  int row;
  bool result;
  int local_28;
  int local_24;
  int second_column_local;
  int first_column_local;
  Matrix *this_local;
  Fraction coefficient_local;
  
  local_28 = second_column;
  local_24 = first_column;
  _second_column_local = this;
  unique0x10000161 = coefficient;
  Fraction::Fraction((Fraction *)&row,0);
  bVar1 = operator==((Fraction *)((long)&this_local + 4),(Fraction *)&row);
  if (bVar1) {
    coefficient_local.numerator_._3_1_ = false;
  }
  else {
    local_31 = 0;
    for (local_38 = 0; local_38 < this->n_; local_38 = local_38 + 1) {
      pvVar2 = std::
               vector<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
               ::operator[](&this->elements_,(long)local_38);
      pvVar3 = std::vector<Fraction,_std::allocator<Fraction>_>::operator[](pvVar2,(long)local_28);
      Fraction::Fraction(&local_40,0);
      bVar1 = operator!=(pvVar3,&local_40);
      if (bVar1) {
        local_31 = 1;
        pvVar2 = std::
                 vector<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
                 ::operator[](&this->elements_,(long)local_38);
        pvVar3 = std::vector<Fraction,_std::allocator<Fraction>_>::operator[](pvVar2,(long)local_28)
        ;
        local_48 = operator*((Fraction *)((long)&this_local + 4),pvVar3);
        pvVar2 = std::
                 vector<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
                 ::operator[](&this->elements_,(long)local_38);
        pvVar3 = std::vector<Fraction,_std::allocator<Fraction>_>::operator[](pvVar2,(long)local_24)
        ;
        Fraction::operator+=(pvVar3,&local_48);
      }
    }
    coefficient_local.numerator_._3_1_ = (bool)(local_31 & 1);
  }
  return coefficient_local.numerator_._3_1_;
}

Assistant:

bool Matrix::AddColumn(int first_column, int second_column, Fraction coefficient) {
  if (coefficient == 0) {
    return false;
  }

  bool result = false;
  for (int row = 0; row < n_; ++row) {
    if (elements_[row][second_column] != 0) {
      result = true;
      elements_[row][first_column] += coefficient * elements_[row][second_column];
    }
  }

  return result;
}